

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O1

RGB __thiscall
pbrt::PixelSensor::ToSensorRGB(PixelSensor *this,SampledSpectrum *s,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  int i;
  long lVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  RGB RVar13;
  SampledSpectrum SVar14;
  float local_68 [4];
  float local_58 [4];
  float local_48 [4];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  auVar12 = in_ZMM1._8_56_;
  auVar8 = in_ZMM0._8_56_;
  SVar14 = DenselySampledSpectrum::Sample(&this->r_bar,lambda);
  auVar9._0_8_ = SVar14.values.values._8_8_;
  auVar9._8_56_ = auVar12;
  auVar5._0_8_ = SVar14.values.values._0_8_;
  auVar5._8_56_ = auVar8;
  auVar3 = vmovlhps_avx(auVar5._0_16_,auVar9._0_16_);
  local_48[0] = auVar3._0_4_ * (s->values).values[0];
  local_48[1] = auVar3._4_4_ * (s->values).values[1];
  local_48[2] = auVar3._8_4_ * (s->values).values[2];
  local_48[3] = auVar3._12_4_ * (s->values).values[3];
  lVar2 = 1;
  fVar4 = local_48[0];
  do {
    fVar4 = fVar4 + local_48[lVar2];
    auVar8 = (undefined1  [56])0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_28 = ZEXT416((uint)fVar4);
  SVar14 = DenselySampledSpectrum::Sample(&this->g_bar,lambda);
  auVar10._0_8_ = SVar14.values.values._8_8_;
  auVar10._8_56_ = auVar12;
  auVar6._0_8_ = SVar14.values.values._0_8_;
  auVar6._8_56_ = auVar8;
  auVar3 = vmovlhps_avx(auVar6._0_16_,auVar10._0_16_);
  local_58[0] = auVar3._0_4_ * (s->values).values[0];
  local_58[1] = auVar3._4_4_ * (s->values).values[1];
  local_58[2] = auVar3._8_4_ * (s->values).values[2];
  local_58[3] = auVar3._12_4_ * (s->values).values[3];
  lVar2 = 1;
  fVar4 = local_58[0];
  do {
    fVar4 = fVar4 + local_58[lVar2];
    auVar8 = (undefined1  [56])0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_38 = ZEXT416((uint)fVar4);
  SVar14 = DenselySampledSpectrum::Sample(&this->b_bar,lambda);
  auVar11._0_8_ = SVar14.values.values._8_8_;
  auVar11._8_56_ = auVar12;
  auVar7._0_8_ = SVar14.values.values._0_8_;
  auVar7._8_56_ = auVar8;
  auVar3 = vmovlhps_avx(auVar7._0_16_,auVar11._0_16_);
  fVar4 = auVar3._0_4_ * (s->values).values[0];
  local_68[1] = auVar3._4_4_ * (s->values).values[1];
  local_68[2] = auVar3._8_4_ * (s->values).values[2];
  local_68[3] = auVar3._12_4_ * (s->values).values[3];
  lVar2 = 1;
  do {
    fVar4 = fVar4 + local_68[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  auVar3 = vinsertps_avx(local_28,ZEXT416((uint)local_38._0_4_),0x10);
  auVar1._8_4_ = 0x3e800000;
  auVar1._0_8_ = 0x3e8000003e800000;
  auVar1._12_4_ = 0x3e800000;
  auVar3 = vmulps_avx512vl(auVar3,auVar1);
  RVar13._0_8_ = auVar3._0_8_;
  RVar13.b = fVar4 * 0.25;
  return RVar13;
}

Assistant:

PBRT_CPU_GPU
    RGB ToSensorRGB(const SampledSpectrum &s, const SampledWavelengths &lambda) const {
        return RGB((r_bar.Sample(lambda) * s).Average(),
                      (g_bar.Sample(lambda) * s).Average(),
                      (b_bar.Sample(lambda) * s).Average());
    }